

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

vector<cv::Mat,_std::allocator<cv::Mat>_> *
get_test_src(vector<cv::Mat,_std::allocator<cv::Mat>_> *__return_storage_ptr__,string *where)

{
  pointer pcVar1;
  DIR *__dirp;
  dirent *pdVar2;
  long *plVar3;
  long *plVar4;
  __string_type __str;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90 [96];
  
  (__return_storage_ptr__->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dirp = opendir((where->_M_dataplus)._M_p);
  while( true ) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 == (dirent *)0x0) break;
    if (pdVar2->d_name[0] != '.') {
      local_d0 = local_c0;
      pcVar1 = (where->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + where->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,'\x01');
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_a0 = *plVar4;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar4;
        local_b0 = (long *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      cv::imread(local_90,(int)&local_b0);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                (__return_storage_ptr__,(Mat *)local_90);
      cv::Mat::~Mat((Mat *)local_90);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Mat> get_test_src(const std::string& where)
{
	std::vector<cv::Mat> ret;
	DIR* dir_ptr = opendir(where.c_str());
	dirent* dptr;
	while((dptr = readdir(dir_ptr)) != NULL)
	{
		if(dptr->d_name[0] == '.')
			continue;
		ret.push_back(cv::imread(where+'/'+dptr->d_name, cv::IMREAD_GRAYSCALE));
	}
	return ret;
}